

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-model.cpp
# Opt level: O0

void __thiscall
llm_build_qwen2vl::llm_build_qwen2vl
          (llm_build_qwen2vl *this,llama_model *model,llm_graph_params *params,ggml_cgraph *gf)

{
  uint uVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  const_reference pvVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ggml_tensor *name;
  llm_graph_context *this_00;
  ggml_tensor *pgVar10;
  ggml_tensor *pgVar11;
  pointer plVar12;
  ggml_tensor *pgVar13;
  ggml_tensor *in_RCX;
  long in_RSI;
  ggml_tensor *in_RDI;
  ggml_tensor *ffn_inp;
  ggml_tensor *inp_out_ids;
  ggml_tensor *Vcur;
  ggml_tensor *Kcur;
  ggml_tensor *Qcur;
  ggml_tensor *inpSA;
  int il;
  int sections [4];
  llm_graph_input_attn_kv_unified *inp_attn;
  ggml_tensor *inp_pos;
  ggml_tensor *inpL;
  ggml_tensor *cur;
  int64_t n_embd_head;
  ggml_tensor *in_stack_fffffffffffffd78;
  int iVar14;
  int il_00;
  llm_graph_context *in_stack_fffffffffffffd80;
  undefined4 uVar15;
  ggml_backend_buffer *name_00;
  ggml_tensor *in_stack_fffffffffffffd88;
  ggml_tensor *cur_00;
  ggml_tensor *in_stack_fffffffffffffd90;
  ggml_tensor *mw;
  ggml_tensor *in_stack_fffffffffffffd98;
  undefined4 uVar16;
  llm_graph_context *in_stack_fffffffffffffda0;
  ggml_tensor *in_stack_fffffffffffffdd0;
  ggml_tensor *in_stack_fffffffffffffdd8;
  ggml_tensor *in_stack_fffffffffffffde0;
  ggml_tensor *pgVar17;
  ggml_tensor *pgVar18;
  ggml_tensor *in_stack_fffffffffffffe10;
  ggml_tensor *in_stack_fffffffffffffe20;
  ggml_tensor *in_stack_fffffffffffffe30;
  ggml_tensor *in_stack_fffffffffffffe38;
  ggml_tensor *in_stack_fffffffffffffe40;
  ggml_tensor *pgVar19;
  llm_ffn_op_type type_op;
  llm_ffn_gate_type type_gate;
  ggml_tensor *in_stack_fffffffffffffe88;
  llm_graph_context *in_stack_fffffffffffffe90;
  ggml_tensor *in_stack_ffffffffffffff50;
  ggml_tensor *in_stack_ffffffffffffff58;
  ggml_tensor *local_88;
  undefined4 in_stack_ffffffffffffff80;
  int iVar20;
  ggml_tensor *in_stack_ffffffffffffff88;
  ggml_tensor *in_stack_ffffffffffffff90;
  ggml_tensor *in_stack_ffffffffffffff98;
  ggml_tensor *pgVar21;
  ggml_tensor *local_50;
  ggml_tensor *local_48;
  
  llm_graph_context::llm_graph_context
            ((llm_graph_context *)in_stack_fffffffffffffd90,
             (llm_graph_params *)in_stack_fffffffffffffd88);
  uVar1 = *(uint *)(in_RDI->buffer + 0x24);
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x20)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1942,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_embd_head_k");
  }
  if (uVar1 != *(uint *)(in_RDI->buffer + 0x14)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-model.cpp"
               ,0x1943,"GGML_ASSERT(%s) failed","n_embd_head == hparams.n_rot");
  }
  local_50 = llm_graph_context::build_inp_embd(in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  pgVar13 = local_50;
  pgVar2 = llm_graph_context::build_inp_pos((llm_graph_context *)in_stack_fffffffffffffde0);
  pgVar3 = (ggml_tensor *)
           llm_graph_context::build_attn_inp_kv_unified
                     ((llm_graph_context *)in_stack_fffffffffffffe20);
  std::begin<std::array<int,4ul>>((array<int,_4UL> *)0x4cd4a4);
  std::begin<std::array<int,4ul>>((array<int,_4UL> *)0x4cd4c6);
  std::copy<int_const*,int*>
            ((int *)in_stack_fffffffffffffd90,(int *)in_stack_fffffffffffffd88,
             (int *)in_stack_fffffffffffffd80);
  for (iVar20 = 0; iVar14 = (int)((ulong)in_stack_fffffffffffffd78 >> 0x20),
      (long)iVar20 < in_RDI->ne[3]; iVar20 = iVar20 + 1) {
    local_88 = local_50;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    llm_graph_context::build_norm
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88,(llm_norm_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
               (int)in_stack_fffffffffffffd80);
    uVar16 = (undefined4)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)in_stack_fffffffffffffd80,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        in_stack_fffffffffffffdd0);
    pgVar19 = in_RDI->src[5];
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    uVar6 = ggml_add(pgVar19,pgVar4,pvVar5->bq);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)in_stack_fffffffffffffd80,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        in_stack_fffffffffffffdd0);
    pgVar19 = in_RDI->src[5];
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    uVar7 = ggml_add(pgVar19,pgVar4,pvVar5->bk);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)in_stack_fffffffffffffd80,iVar14);
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar4 = llm_graph_context::build_lora_mm
                       ((llm_graph_context *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                        in_stack_fffffffffffffdd0);
    pgVar19 = in_RDI->src[5];
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    uVar8 = ggml_add(pgVar19,pgVar4,pvVar5->bv);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)in_stack_fffffffffffffd80,iVar14);
    uVar15 = (undefined4)((ulong)in_stack_fffffffffffffd80 >> 0x20);
    uVar9 = ggml_reshape_3d(in_RDI->src[5],uVar6,uVar1,in_RDI->nb[3],(long)*(int *)(in_RDI->src + 2)
                           );
    uVar6._0_4_ = in_RDI->op;
    uVar6._4_4_ = in_RDI->op_params[0];
    uVar6 = ggml_reshape_3d(in_RDI->src[5],uVar7,uVar1,uVar6,(long)*(int *)(in_RDI->src + 2));
    uVar7._0_4_ = in_RDI->op;
    uVar7._4_4_ = in_RDI->op_params[0];
    name = (ggml_tensor *)
           ggml_reshape_3d(in_RDI->src[5],uVar8,uVar1,uVar7,(long)*(int *)(in_RDI->src + 2));
    this_00 = (llm_graph_context *)
              ggml_rope_multi(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                              in_RDI->flags,*(undefined4 *)in_RDI->src,
                              *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar9,pgVar2,0,
                              (int)in_RDI->nb[0],&stack0xffffffffffffff88);
    name_00 = (ggml_backend_buffer *)CONCAT44(uVar15,*(undefined4 *)(in_RDI->src + 3));
    pgVar10 = (ggml_tensor *)
              ggml_rope_multi(in_RDI->op_params[0xd],in_RDI->op_params[0xe],in_RDI->op_params[0xf],
                              in_RDI->flags,*(undefined4 *)in_RDI->src,
                              *(undefined4 *)((long)in_RDI->src + 4),in_RDI->src[5],uVar6,pgVar2,0,
                              (int)in_RDI->nb[0],&stack0xffffffffffffff88);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)name_00,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)name_00,iVar14);
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)name_00,iVar14);
    pgVar19 = in_RCX;
    pgVar21 = pgVar3;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    type_op = (llm_ffn_op_type)pgVar19;
    type_gate = (llm_ffn_gate_type)pvVar5->wo;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    iVar14 = (int)pvVar5->bo;
    pgVar17 = name;
    pgVar18 = pgVar10;
    sqrtf((float)uVar1);
    pgVar11 = (ggml_tensor *)CONCAT44(uVar16,iVar20);
    mw = (ggml_tensor *)0x0;
    cur_00 = (ggml_tensor *)0x0;
    pgVar19 = name;
    pgVar4 = pgVar10;
    local_48 = llm_graph_context::build_attn
                         (this_00,(llm_graph_input_attn_kv_unified *)pgVar18,(ggml_cgraph *)pgVar17,
                          in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_RDI,
                          (ggml_tensor *)CONCAT44(iVar20,in_stack_ffffffffffffff80),
                          in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
                          in_stack_ffffffffffffff98,(float)((ulong)pgVar13 >> 0x20),(int)pgVar21);
    il_00 = (int)((ulong)pgVar10 >> 0x20);
    if ((long)iVar20 == in_RDI->ne[3] + -1) {
      in_stack_fffffffffffffe40 =
           llm_graph_context::build_inp_out_ids((llm_graph_context *)in_stack_fffffffffffffdd0);
      in_stack_ffffffffffffff58 = in_stack_fffffffffffffe40;
      local_48 = (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_48,in_stack_fffffffffffffe40);
      in_stack_fffffffffffffe38 = local_48;
      in_stack_fffffffffffffe30 =
           (ggml_tensor *)ggml_get_rows(in_RDI->src[5],local_50,in_stack_ffffffffffffff58);
      local_88 = in_stack_fffffffffffffe30;
    }
    pgVar10 = (ggml_tensor *)ggml_add(in_RDI->src[5],local_48,local_88);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    in_stack_ffffffffffffff50 = pgVar10;
    std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
              ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),(long)iVar20);
    pgVar11 = llm_graph_context::build_norm
                        (in_stack_fffffffffffffda0,pgVar11,mw,cur_00,
                         (llm_norm_type)((ulong)name >> 0x20),(int)name);
    llm_graph_context::cb((llm_graph_context *)mw,cur_00,(char *)name,il_00);
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    pgVar17 = pvVar5->ffn_up;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    pgVar18 = pvVar5->ffn_gate;
    pvVar5 = std::vector<llama_layer,_std::allocator<llama_layer>_>::operator[]
                       ((vector<llama_layer,_std::allocator<llama_layer>_> *)(in_RSI + 0x19e0),
                        (long)iVar20);
    in_stack_fffffffffffffd88 = pvVar5->ffn_down;
    in_stack_fffffffffffffda0 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd98 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd90 = (ggml_tensor *)0x0;
    in_stack_fffffffffffffd80 = (llm_graph_context *)0x0;
    in_stack_fffffffffffffd78 = (ggml_tensor *)0x0;
    pgVar3 = llm_graph_context::build_ffn
                       ((llm_graph_context *)pgVar11,pgVar10,in_stack_fffffffffffffe10,
                        (ggml_tensor *)&stack0xfffffffffffffd78,pgVar18,pgVar17,
                        in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,
                        in_stack_fffffffffffffe40,pgVar19,pgVar4,pgVar3,type_op,type_gate,iVar14);
    in_stack_fffffffffffffe10 = pgVar3;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    ggml_add(in_RDI->src[5],pgVar3,in_stack_ffffffffffffff50);
    local_50 = llm_graph_context::build_cvec(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,0);
    in_stack_fffffffffffffde0 = local_50;
    llm_graph_context::cb
              ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
               (char *)in_stack_fffffffffffffd80,(int)((ulong)in_stack_fffffffffffffd78 >> 0x20));
    pgVar3 = pgVar21;
  }
  pgVar3 = llm_graph_context::build_norm
                     (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                      in_stack_fffffffffffffd88,
                      (llm_norm_type)((ulong)in_stack_fffffffffffffd80 >> 0x20),
                      (int)in_stack_fffffffffffffd80);
  pgVar13 = pgVar3;
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (char *)in_stack_fffffffffffffd80,iVar14);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4ce094);
  plVar12->t_embd = pgVar3;
  pgVar13 = llm_graph_context::build_lora_mm
                      ((llm_graph_context *)in_stack_fffffffffffffde0,pgVar13,
                       in_stack_fffffffffffffdd0);
  llm_graph_context::cb
            ((llm_graph_context *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
             (char *)in_stack_fffffffffffffd80,iVar14);
  plVar12 = std::unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_>::operator->
                      ((unique_ptr<llm_graph_result,_std::default_delete<llm_graph_result>_> *)
                       0x4ce119);
  plVar12->t_logits = pgVar13;
  ggml_build_forward_expand(in_RCX,pgVar13);
  return;
}

Assistant:

llm_build_qwen2vl(const llama_model & model, const llm_graph_params & params, ggml_cgraph * gf) : llm_graph_context(params) {
        const int64_t n_embd_head = hparams.n_embd_head_v;

        GGML_ASSERT(n_embd_head == hparams.n_embd_head_k);
        GGML_ASSERT(n_embd_head == hparams.n_rot);

        ggml_tensor * cur;
        ggml_tensor * inpL;

        inpL = build_inp_embd(model.tok_embd);

        // inp_pos - contains the positions
        ggml_tensor * inp_pos = build_inp_pos();

        auto * inp_attn = build_attn_inp_kv_unified();

        int sections[4];
        std::copy(std::begin(hparams.rope_sections), std::begin(hparams.rope_sections) + 4, sections);

        for (int il = 0; il < n_layer; ++il) {
            ggml_tensor * inpSA = inpL;

            // norm
            cur = build_norm(inpL,
                    model.layers[il].attn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "attn_norm", il);

            // self-attention
            {
                // compute Q and K and RoPE them
                ggml_tensor * Qcur = build_lora_mm(model.layers[il].wq, cur);
                Qcur = ggml_add(ctx0, Qcur, model.layers[il].bq);
                cb(Qcur, "Qcur", il);

                ggml_tensor * Kcur = build_lora_mm(model.layers[il].wk, cur);
                Kcur = ggml_add(ctx0, Kcur, model.layers[il].bk);
                cb(Kcur, "Kcur", il);

                ggml_tensor * Vcur = build_lora_mm(model.layers[il].wv, cur);
                Vcur = ggml_add(ctx0, Vcur, model.layers[il].bv);
                cb(Vcur, "Vcur", il);

                Qcur = ggml_reshape_3d(ctx0, Qcur, n_embd_head, n_head,    n_tokens);
                Kcur = ggml_reshape_3d(ctx0, Kcur, n_embd_head, n_head_kv, n_tokens);
                Vcur = ggml_reshape_3d(ctx0, Vcur, n_embd_head, n_head_kv, n_tokens);

                Qcur = ggml_rope_multi(
                        ctx0, Qcur, inp_pos, nullptr,
                        n_rot, sections, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                Kcur = ggml_rope_multi(
                        ctx0, Kcur, inp_pos, nullptr,
                        n_rot, sections, rope_type, n_ctx_orig, freq_base, freq_scale,
                        ext_factor, attn_factor, beta_fast, beta_slow
                        );

                cb(Qcur, "Qcur", il);
                cb(Kcur, "Kcur", il);
                cb(Vcur, "Vcur", il);

                cur = build_attn(inp_attn, gf,
                        model.layers[il].wo, model.layers[il].bo,
                        Qcur, Kcur, Vcur, nullptr, nullptr, 1.0f/sqrtf(float(n_embd_head)), il);
            }

            if (il == n_layer - 1) {
                // skip computing output for unused tokens
                ggml_tensor * inp_out_ids = build_inp_out_ids();
                cur   = ggml_get_rows(ctx0,   cur, inp_out_ids);
                inpSA = ggml_get_rows(ctx0, inpSA, inp_out_ids);
            }

            ggml_tensor * ffn_inp = ggml_add(ctx0, cur, inpSA);
            cb(ffn_inp, "ffn_inp", il);

            // feed-forward network
            cur = build_norm(ffn_inp,
                    model.layers[il].ffn_norm, NULL,
                    LLM_NORM_RMS, il);
            cb(cur, "ffn_norm", il);

            cur = build_ffn(cur,
                    model.layers[il].ffn_up,   NULL, NULL,
                    model.layers[il].ffn_gate, NULL, NULL,
                    model.layers[il].ffn_down, NULL, NULL,
                    NULL,
                    LLM_FFN_SILU, LLM_FFN_PAR, il);
            cb(cur, "ffn_out", il);

            cur = ggml_add(ctx0, cur, ffn_inp);

            cur = build_cvec(cur, il);
            cb(cur, "l_out", il);

            // input for next layer
            inpL = cur;
        }

        cur = inpL;

        cur = build_norm(cur,
                model.output_norm, NULL,
                LLM_NORM_RMS, -1);

        cb(cur, "result_norm", -1);
        res->t_embd = cur;

        // lm_head
        cur = build_lora_mm(model.output, cur);

        cb(cur, "result_output", -1);
        res->t_logits = cur;

        ggml_build_forward_expand(gf, cur);
    }